

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingDescriptorPoller.cpp
# Opt level: O1

void __thiscall
aeron::archive::RecordingDescriptorPoller::RecordingDescriptorPoller
          (RecordingDescriptorPoller *this,shared_ptr<aeron::Subscription> *subscription,
          int32_t fragmentLimit,int64_t controlSessionId)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (this->subscription_).super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (subscription->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (subscription->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->subscription_).super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->fragmentLimit_ = fragmentLimit;
  this->controlSessionId_ = controlSessionId;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp:33:26)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp:33:26)>
             ::_M_manager;
  (this->fragmentAssembler_).m_initialBufferLength = 0x1000;
  local_38._M_unused._M_object = this;
  std::
  function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
  ::function(&(this->fragmentAssembler_).m_delegate,
             (function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
              *)&local_38);
  (this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_buckets =
       &(this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_single_bucket;
  (this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_bucket_count = 1;
  (this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_element_count = 0;
  (this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fragmentAssembler_).m_builderBySessionIdMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  (this->consumer_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->consumer_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->consumer_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->consumer_).super__Function_base._M_functor + 8) = 0;
  this->isDispatchComplete_ = false;
  return;
}

Assistant:

RecordingDescriptorPoller::RecordingDescriptorPoller(const std::shared_ptr<Subscription>& subscription,
                                                     std::int32_t fragmentLimit, std::int64_t controlSessionId)
    : subscription_(subscription)
    , fragmentLimit_(fragmentLimit)
    , controlSessionId_(controlSessionId)
    , fragmentAssembler_([this](concurrent::AtomicBuffer& buffer, util::index_t offset, util::index_t length,
                                Header& header) { return onFragment(buffer, offset, length, header); }) {}